

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O0

void __thiscall QPDF::createFromJSON(QPDF *this,string *json_file)

{
  shared_ptr<FileInputSource> local_38;
  shared_ptr<InputSource> local_28;
  string *local_18;
  string *json_file_local;
  QPDF *this_local;
  
  local_18 = json_file;
  json_file_local = (string *)this;
  std::__cxx11::string::c_str();
  std::make_shared<FileInputSource,char_const*>((char **)&local_38);
  std::shared_ptr<InputSource>::shared_ptr<FileInputSource,void>(&local_28,&local_38);
  createFromJSON(this,&local_28);
  std::shared_ptr<InputSource>::~shared_ptr(&local_28);
  std::shared_ptr<FileInputSource>::~shared_ptr(&local_38);
  return;
}

Assistant:

void
QPDF::createFromJSON(std::string const& json_file)
{
    createFromJSON(std::make_shared<FileInputSource>(json_file.c_str()));
}